

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O2

void __thiscall Type::Prepare(Type *this,Env *env,int flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Field *pFVar5;
  undefined4 extraout_var;
  Type *pTVar6;
  ID *pIVar7;
  LetField *this_00;
  Field *pFVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  FieldList *pFVar9;
  Type *in_RCX;
  Expr *expr;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *in_R8;
  pointer ppFVar10;
  string local_80;
  string local_60;
  
  this->env_ = env;
  if (this->value_var_ == (ID *)0x0) {
    strfmt_abi_cxx11_((string *)&stack0xffffffffffffffc0,"%s",
                      (this->type_decl_id_->name)._M_dataplus._M_p);
  }
  else {
    in_RCX = (Type *)(this->value_var_->name)._M_dataplus._M_p;
    strfmt_abi_cxx11_((string *)&stack0xffffffffffffffc0,"%s:%s",
                      (this->type_decl_id_->name)._M_dataplus._M_p);
  }
  std::__cxx11::string::operator=((string *)&this->data_id_str_,(string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  pFVar8 = (Field *)this->value_var_;
  if (pFVar8 != (Field *)0x0) {
    in_RCX = this;
    Env::AddID(this->env_,(ID *)pFVar8,this->value_var_type_,this);
    pcVar4 = Env::LValue(this->env_,this->value_var_);
    strfmt_abi_cxx11_((string *)&stack0xffffffffffffffc0,"%s",pcVar4);
    pFVar8 = (Field *)&stack0xffffffffffffffc0;
    std::__cxx11::string::operator=((string *)&this->lvalue_,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  }
  iVar3 = (int)in_RCX;
  pFVar9 = this->attr_letfields_;
  if (pFVar9 != (FieldList *)0x0) {
    for (ppFVar10 = (pFVar9->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
                    super__Vector_impl_data._M_start; iVar3 = (int)in_RCX,
        ppFVar10 !=
        (pFVar9->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
      pFVar8 = *ppFVar10;
      AddField(this,pFVar8);
      pFVar9 = this->attr_letfields_;
    }
  }
  if (this->attr_exportsourcedata_ == true) {
    pFVar5 = (Field *)operator_new(0xa0);
    iVar2 = ID::clone(sourcedata_id,(__fn *)pFVar8,__child_stack,iVar3,in_R8);
    pTVar6 = Clone(&extern_type_const_bytestring->super_Type);
    PubVarField::PubVarField((PubVarField *)pFVar5,(ID *)CONCAT44(extraout_var,iVar2),pTVar6);
    AddField(this,pFVar5);
  }
  if (this->attr_if_expr_ != (Expr *)0x0) {
    pIVar7 = (ID *)operator_new(0x78);
    strfmt_abi_cxx11_(&local_60,"has_%s",(this->value_var_->name)._M_dataplus._M_p);
    ID::ID(pIVar7,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = (LetField *)operator_new(0xb0);
    pTVar6 = Clone(&extern_type_bool->super_Type);
    expr = this->attr_if_expr_;
    LetField::LetField(this_00,pIVar7,pTVar6,expr);
    iVar3 = (int)expr;
    this->has_value_field_ = this_00;
    AddField(this,(Field *)this_00);
  }
  if (this->incremental_input_ == true) {
    pIVar7 = (ID *)operator_new(0x78);
    if (this->value_var_ == (ID *)0x0) {
      pcVar4 = "val";
    }
    else {
      pcVar4 = (this->value_var_->name)._M_dataplus._M_p;
    }
    strfmt_abi_cxx11_(&local_80,"%s_parsing_complete",pcVar4);
    ID::ID(pIVar7,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (FLAGS_pac_debug == true) {
      fprintf(_stderr,"Adding parsing complete var: %s\n",(pIVar7->name)._M_dataplus._M_p);
    }
    pFVar5 = (Field *)operator_new(0xa0);
    pTVar6 = Clone(&extern_type_bool->super_Type);
    TempVarField::TempVarField((TempVarField *)pFVar5,pIVar7,pTVar6);
    this->parsing_complete_var_field_ = pFVar5;
    pFVar8 = (Field *)env;
    (*(((Field *)&pFVar5->super_DataDepElement)->super_DataDepElement)._vptr_DataDepElement[4])
              (pFVar5);
    bVar1 = NeedsBufferingStateVar(this);
    if (bVar1) {
      pFVar5 = (Field *)buffering_state_id;
      pTVar6 = Env::GetDataType(env,buffering_state_id);
      pFVar8 = pFVar5;
      if (pTVar6 == (Type *)0x0) {
        pFVar8 = (Field *)operator_new(0xa0);
        iVar2 = ID::clone(buffering_state_id,(__fn *)pFVar5,__child_stack_00,iVar3,in_R8);
        pTVar6 = Clone(&extern_type_int->super_Type);
        PrivVarField::PrivVarField
                  ((PrivVarField *)pFVar8,(ID *)CONCAT44(extraout_var_00,iVar2),pTVar6);
        this->buffering_state_var_field_ = pFVar8;
        AddField(this,pFVar8);
      }
    }
    if ((this->incremental_parsing_ == true) && (this->tot_ == RECORD)) {
      pFVar5 = (Field *)operator_new(0xa0);
      iVar3 = ID::clone(parsing_state_id,(__fn *)pFVar8,__child_stack_01,iVar3,in_R8);
      pTVar6 = Clone(&extern_type_int->super_Type);
      PrivVarField::PrivVarField
                ((PrivVarField *)pFVar5,(ID *)CONCAT44(extraout_var_01,iVar3),pTVar6);
      this->parsing_state_var_field_ = pFVar5;
      AddField(this,pFVar5);
    }
  }
  pFVar9 = this->fields_;
  if (pFVar9 != (FieldList *)0x0) {
    for (ppFVar10 = (pFVar9->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        ppFVar10 !=
        (pFVar9->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppFVar10 = ppFVar10 + 1) {
      (*((*ppFVar10)->super_DataDepElement)._vptr_DataDepElement[4])(*ppFVar10,env);
      pFVar9 = this->fields_;
    }
  }
  return;
}

Assistant:

void Type::Prepare(Env* env, int flags)
	{
	env_ = env;
	ASSERT(env_);

	// The name of the value variable
	if ( value_var() )
		{
		data_id_str_ = strfmt("%s:%s", decl_id()->Name(), value_var()->Name());
		}
	else
		{
		data_id_str_ = strfmt("%s", decl_id()->Name());
		}

	if ( value_var() )
		{
		env_->AddID(value_var(), static_cast<IDType>(value_var_type_), this);
		lvalue_ = strfmt("%s", env_->LValue(value_var()));
		}

	foreach (i, FieldList, attr_letfields_)
		{
		AddField(*i);
		}

	if ( attr_exportsourcedata_ )
		{
		ASSERT(flags & TO_BE_PARSED);
		AddField(new PubVarField(sourcedata_id->clone(), extern_type_const_bytestring->Clone()));
		}

	// An optional field
	if ( attr_if_expr() )
		{
		ASSERT(value_var());
		ID* has_value_id = new ID(strfmt("has_%s", value_var()->Name()));
		has_value_field_ = new LetField(has_value_id, extern_type_bool->Clone(), attr_if_expr());
		AddField(has_value_field_);
		}

	if ( incremental_input() )
		{
		ASSERT(flags & TO_BE_PARSED);
		ID* parsing_complete_var = new ID(
			strfmt("%s_parsing_complete", value_var() ? value_var()->Name() : "val"));
		DEBUG_MSG("Adding parsing complete var: %s\n", parsing_complete_var->Name());
		parsing_complete_var_field_ = new TempVarField(parsing_complete_var,
		                                               extern_type_bool->Clone());
		parsing_complete_var_field_->Prepare(env);

		if ( NeedsBufferingStateVar() && ! env->GetDataType(buffering_state_id) )
			{
			buffering_state_var_field_ = new PrivVarField(buffering_state_id->clone(),
			                                              extern_type_int->Clone());
			AddField(buffering_state_var_field_);
			}

		if ( incremental_parsing() && tot_ == RECORD )
			{
			ASSERT(! parsing_state_var_field_);
			parsing_state_var_field_ = new PrivVarField(parsing_state_id->clone(),
			                                            extern_type_int->Clone());
			AddField(parsing_state_var_field_);
			}
		}

	foreach (i, FieldList, fields_)
		{
		Field* f = *i;
		f->Prepare(env);
		}
	}